

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzer.cpp
# Opt level: O0

void __thiscall SerialAnalyzer::SetupResults(SerialAnalyzer *this)

{
  SerialAnalyzerResults *this_00;
  pointer settings;
  pointer pSVar1;
  SerialAnalyzer *this_local;
  
  this_00 = (SerialAnalyzerResults *)operator_new(0x20);
  settings = std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::
             get(&this->mSettings);
  SerialAnalyzerResults::SerialAnalyzerResults(this_00,this,settings);
  std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>::reset
            (&this->mResults,this_00);
  std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>::get
            (&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  pSVar1 = std::unique_ptr<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>::
           operator->(&this->mResults);
  std::unique_ptr<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>::operator->
            (&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)pSVar1);
  return;
}

Assistant:

void SerialAnalyzer::SetupResults()
{
    // Unlike the worker thread, this function is called from the GUI thread
    // we need to reset the Results object here because it is exposed for direct access by the GUI, and it can't be deleted from the
    // WorkerThread

    mResults.reset( new SerialAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}